

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Instruction::IsValidBasePointer(Instruction *this)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  IRContext *pIVar4;
  DefUseManager *pDVar5;
  Instruction *pIVar6;
  FeatureManager *this_00;
  Instruction *pointee_type_inst;
  uint32_t pointee_type_id;
  StorageClass storage_class;
  FeatureManager *feature_mgr;
  Instruction *type;
  uint32_t tid;
  Instruction *this_local;
  
  uVar2 = type_id(this);
  if (uVar2 == 0) {
    this_local._7_1_ = false;
  }
  else {
    pIVar4 = context(this);
    pDVar5 = IRContext::get_def_use_mgr(pIVar4);
    pIVar6 = analysis::DefUseManager::GetDef(pDVar5,uVar2);
    OVar3 = opcode(pIVar6);
    if (OVar3 == OpTypePointer) {
      pIVar4 = context(this);
      this_00 = IRContext::get_feature_mgr(pIVar4);
      bVar1 = FeatureManager::HasCapability(this_00,Addresses);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        OVar3 = opcode(this);
        if ((OVar3 == OpVariable) || (OVar3 = opcode(this), OVar3 == OpFunctionParameter)) {
          this_local._7_1_ = true;
        }
        else {
          uVar2 = GetSingleWordInOperand(pIVar6,0);
          bVar1 = FeatureManager::HasCapability(this_00,VariablePointersStorageBuffer);
          if ((((bVar1) && (uVar2 == 0xc)) ||
              ((bVar1 = FeatureManager::HasCapability(this_00,VariablePointers), bVar1 &&
               (uVar2 == 4)))) &&
             ((OVar3 = opcode(this), OVar3 == OpConstantNull ||
              (((OVar3 == OpFunctionCall || (OVar3 == OpSelect)) || (OVar3 == OpPhi)))))) {
            this_local._7_1_ = true;
          }
          else {
            uVar2 = GetSingleWordInOperand(pIVar6,1);
            pIVar4 = context(this);
            pDVar5 = IRContext::get_def_use_mgr(pIVar4);
            pIVar6 = analysis::DefUseManager::GetDef(pDVar5,uVar2);
            bVar1 = IsOpaqueType(pIVar6);
            if (bVar1) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Instruction::IsValidBasePointer() const {
  uint32_t tid = type_id();
  if (tid == 0) {
    return false;
  }

  Instruction* type = context()->get_def_use_mgr()->GetDef(tid);
  if (type->opcode() != spv::Op::OpTypePointer) {
    return false;
  }

  auto feature_mgr = context()->get_feature_mgr();
  if (feature_mgr->HasCapability(spv::Capability::Addresses)) {
    // TODO: The rules here could be more restrictive.
    return true;
  }

  if (opcode() == spv::Op::OpVariable ||
      opcode() == spv::Op::OpFunctionParameter) {
    return true;
  }

  // With variable pointers, there are more valid base pointer objects.
  // Variable pointers implicitly declares Variable pointers storage buffer.
  spv::StorageClass storage_class =
      static_cast<spv::StorageClass>(type->GetSingleWordInOperand(0));
  if ((feature_mgr->HasCapability(
           spv::Capability::VariablePointersStorageBuffer) &&
       storage_class == spv::StorageClass::StorageBuffer) ||
      (feature_mgr->HasCapability(spv::Capability::VariablePointers) &&
       storage_class == spv::StorageClass::Workgroup)) {
    switch (opcode()) {
      case spv::Op::OpPhi:
      case spv::Op::OpSelect:
      case spv::Op::OpFunctionCall:
      case spv::Op::OpConstantNull:
        return true;
      default:
        break;
    }
  }

  uint32_t pointee_type_id = type->GetSingleWordInOperand(1);
  Instruction* pointee_type_inst =
      context()->get_def_use_mgr()->GetDef(pointee_type_id);

  if (pointee_type_inst->IsOpaqueType()) {
    return true;
  }
  return false;
}